

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void celero::executor::Run(string *benchmarkName,string *experimentName)

{
  bool bVar1;
  string *psVar2;
  shared_ptr<celero::Experiment> local_58 [2];
  undefined1 local_38 [8];
  shared_ptr<celero::Experiment> e;
  shared_ptr<celero::Benchmark> bmark;
  string *experimentName_local;
  string *benchmarkName_local;
  
  psVar2 = (string *)TestVector::Instance();
  TestVector::operator[]
            ((TestVector *)
             &e.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             psVar2);
  bVar1 = std::operator!=((shared_ptr<celero::Benchmark> *)
                          &e.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(nullptr_t)0x0);
  if (bVar1) {
    psVar2 = (string *)
             std::__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&e.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    Benchmark::getExperiment((Benchmark *)local_38,psVar2);
    bVar1 = std::operator!=((shared_ptr<celero::Experiment> *)local_38,(nullptr_t)0x0);
    if (!bVar1) {
      __assert_fail("e != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/Executor.cpp"
                    ,0x1a0,"void celero::executor::Run(const std::string &, const std::string &)");
    }
    std::shared_ptr<celero::Experiment>::shared_ptr
              (local_58,(shared_ptr<celero::Experiment> *)local_38);
    Run(local_58);
    std::shared_ptr<celero::Experiment>::~shared_ptr(local_58);
    std::shared_ptr<celero::Experiment>::~shared_ptr((shared_ptr<celero::Experiment> *)local_38);
  }
  std::shared_ptr<celero::Benchmark>::~shared_ptr
            ((shared_ptr<celero::Benchmark> *)
             &e.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void executor::Run(const std::string& benchmarkName, const std::string& experimentName)
{
	auto bmark = celero::TestVector::Instance()[benchmarkName];

	if(bmark != nullptr)
	{
		auto e = bmark->getExperiment(experimentName);
		assert(e != nullptr);
		executor::Run(e);
	}
}